

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::FindBestWindowPosForPopupEx
                 (ImVec2 *ref_pos,ImVec2 *size,ImGuiDir *last_dir,ImRect *r_outer,ImRect *r_avoid,
                 ImGuiPopupPositionPolicy policy)

{
  float fVar1;
  float fVar2;
  ImVec2 IVar3;
  int iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint *puVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  undefined8 unaff_RBP;
  int *piVar12;
  uint *puVar13;
  ImGuiDir *pIVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  ImVec2 IVar18;
  ImVec2 IVar19;
  ImVec2 IVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar27;
  undefined1 auVar26 [16];
  float fVar28;
  float fVar29;
  float fVar30;
  ImVec2 IVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  
  IVar3 = *ref_pos;
  auVar22._8_8_ = 0;
  auVar22._0_4_ = IVar3.x;
  auVar22._4_4_ = IVar3.y;
  IVar20 = r_outer->Max;
  fVar28 = IVar20.x;
  fVar29 = IVar20.y;
  fVar25 = (*size).x;
  fVar27 = (*size).y;
  fVar23 = (r_outer->Min).x;
  fVar24 = (r_outer->Min).y;
  if (policy == ImGuiPopupPositionPolicy_ComboBox) {
    iVar4 = *last_dir;
    uVar9 = (ulong)(iVar4 == -1);
    IVar31.x = (r_avoid->Max).x - fVar25;
    fVar33 = (r_avoid->Min).y - fVar27;
    fVar1 = (r_avoid->Max).y;
    IVar31.y = fVar1;
    IVar19.x = (*r_avoid).Min;
    piVar12 = (int *)(&DAT_00171310 + (ulong)(iVar4 != -1) * -4);
    do {
      pIVar14 = last_dir;
      if (uVar9 != 0) {
        pIVar14 = piVar12;
      }
      iVar5 = *pIVar14;
      if ((uVar9 == 0) || (iVar5 != iVar4)) {
        switch(iVar5) {
        case 0:
          IVar18 = IVar31;
          break;
        case 1:
          IVar18.y = fVar33;
          IVar18.x = IVar19.x;
          break;
        case 2:
          IVar18.y = fVar33;
          IVar18.x = IVar31.x;
          break;
        case 3:
          IVar19.y = fVar1;
          IVar18 = IVar19;
          break;
        default:
          IVar18.x = 0.0;
          IVar18.y = 0.0;
        }
        fVar34 = IVar18.x;
        iVar15 = -(uint)(fVar25 + fVar34 <= fVar28);
        iVar16 = -(uint)(fVar27 + IVar18.y <= fVar29);
        auVar7._4_4_ = iVar15;
        auVar7._0_4_ = iVar15;
        auVar7._8_4_ = iVar16;
        auVar7._12_4_ = iVar16;
        uVar11 = movmskpd((int)CONCAT71((int7)((ulong)unaff_RBP >> 8),fVar23 <= fVar34),auVar7);
        bVar10 = (byte)((ulong)uVar11 & 0xffffffffffffff02) >> 1 &
                 -(fVar24 <= IVar18.y) & fVar23 <= fVar34 & (byte)uVar11;
        unaff_RBP = CONCAT71((int7)(((ulong)uVar11 & 0xffffffffffffff02) >> 8),bVar10);
        if (bVar10 == 1) {
          *last_dir = iVar5;
          return IVar18;
        }
      }
      uVar9 = uVar9 + 1;
      piVar12 = piVar12 + 1;
    } while (uVar9 != 5);
  }
  if ((policy & ~ImGuiPopupPositionPolicy_Tooltip) == ImGuiPopupPositionPolicy_Default) {
    auVar21._0_4_ = fVar28 - fVar25;
    auVar21._4_4_ = fVar29 - fVar27;
    auVar21._8_8_ = 0;
    uVar11 = -(uint)(IVar3.x < fVar23);
    uVar17 = -(uint)(IVar3.y < fVar24);
    auVar22 = minps(auVar21,auVar22);
    fVar30 = (float)(~uVar11 & auVar22._0_4_ | (uint)fVar23 & uVar11);
    fVar32 = (float)(~uVar17 & auVar22._4_4_ | (uint)fVar24 & uVar17);
    uVar11 = *last_dir;
    uVar9 = (ulong)(uVar11 == 0xffffffff);
    fVar1 = (r_avoid->Min).x;
    fVar33 = (r_avoid->Min).y;
    fVar34 = (r_avoid->Max).x;
    fVar2 = (r_avoid->Max).y;
    puVar13 = (uint *)(&DAT_00172d60 + (ulong)(uVar11 != 0xffffffff) * -4);
    do {
      puVar8 = (uint *)last_dir;
      if (uVar9 != 0) {
        puVar8 = puVar13;
      }
      uVar17 = *puVar8;
      if ((uVar9 == 0) || (uVar17 != uVar11)) {
        fVar35 = fVar1;
        if (uVar17 != 0) {
          fVar35 = fVar28;
        }
        fVar36 = fVar34;
        if (uVar17 != 1) {
          fVar36 = fVar23;
        }
        if (fVar25 <= fVar35 - fVar36 || 1 < uVar17) {
          fVar35 = fVar33;
          if (uVar17 != 2) {
            fVar35 = fVar29;
          }
          fVar36 = fVar2;
          if (uVar17 != 3) {
            fVar36 = fVar24;
          }
          if ((fVar27 <= fVar35 - fVar36) || ((uVar17 & 0xfffffffe) != 2)) {
            if (uVar17 == 0) {
              fVar34 = fVar1 - fVar25;
            }
            else if (uVar17 != 1) {
              fVar34 = fVar30;
              if (uVar17 == 2) {
                fVar32 = fVar33 - fVar27;
              }
              else if (uVar17 == 3) {
                fVar32 = fVar2;
              }
            }
            *last_dir = uVar17;
            return (ImVec2)(CONCAT44(~-(uint)(fVar24 <= fVar32) & (uint)fVar24,
                                     ~-(uint)(fVar23 <= fVar34) & (uint)fVar23) |
                           CONCAT44((uint)fVar32 & -(uint)(fVar24 <= fVar32),
                                    (uint)fVar34 & -(uint)(fVar23 <= fVar34)));
          }
        }
      }
      uVar9 = uVar9 + 1;
      puVar13 = puVar13 + 1;
    } while (uVar9 != 5);
  }
  *last_dir = -1;
  if (policy == ImGuiPopupPositionPolicy_Tooltip) {
    IVar20.x = IVar3.x + 2.0;
    IVar20.y = IVar3.y + 2.0;
  }
  else {
    auVar26._0_4_ = (*ref_pos).x + fVar25;
    auVar26._4_4_ = (*ref_pos).y + fVar27;
    auVar26._8_8_ = 0;
    auVar6._8_8_ = 0;
    auVar6._0_4_ = IVar20.x;
    auVar6._4_4_ = IVar20.y;
    auVar22 = minps(auVar26,auVar6);
    fVar25 = auVar22._0_4_ - fVar25;
    fVar27 = auVar22._4_4_ - fVar27;
    uVar11 = -(uint)(fVar23 <= fVar25);
    uVar17 = -(uint)(fVar24 <= fVar27);
    IVar20 = (ImVec2)(CONCAT44(~uVar17 & (uint)fVar24,~uVar11 & (uint)fVar23) |
                     CONCAT44((uint)fVar27 & uVar17,(uint)fVar25 & uVar11));
  }
  return IVar20;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopupEx(const ImVec2& ref_pos, const ImVec2& size, ImGuiDir* last_dir, const ImRect& r_outer, const ImRect& r_avoid, ImGuiPopupPositionPolicy policy)
{
    ImVec2 base_pos_clamped = ImClamp(ref_pos, r_outer.Min, r_outer.Max - size);
    //GetForegroundDrawList()->AddRect(r_avoid.Min, r_avoid.Max, IM_COL32(255,0,0,255));
    //GetForegroundDrawList()->AddRect(r_outer.Min, r_outer.Max, IM_COL32(0,255,0,255));

    // Combo Box policy (we want a connecting edge)
    if (policy == ImGuiPopupPositionPolicy_ComboBox)
    {
        const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Down, ImGuiDir_Right, ImGuiDir_Left, ImGuiDir_Up };
        for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
        {
            const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
            if (n != -1 && dir == *last_dir) // Already tried this direction?
                continue;
            ImVec2 pos;
            if (dir == ImGuiDir_Down)  pos = ImVec2(r_avoid.Min.x, r_avoid.Max.y);          // Below, Toward Right (default)
            if (dir == ImGuiDir_Right) pos = ImVec2(r_avoid.Min.x, r_avoid.Min.y - size.y); // Above, Toward Right
            if (dir == ImGuiDir_Left)  pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Max.y); // Below, Toward Left
            if (dir == ImGuiDir_Up)    pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Min.y - size.y); // Above, Toward Left
            if (!r_outer.Contains(ImRect(pos, pos + size)))
                continue;
            *last_dir = dir;
            return pos;
        }
    }

    // Tooltip and Default popup policy
    // (Always first try the direction we used on the last frame, if any)
    if (policy == ImGuiPopupPositionPolicy_Tooltip || policy == ImGuiPopupPositionPolicy_Default)
    {
        const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Right, ImGuiDir_Down, ImGuiDir_Up, ImGuiDir_Left };
        for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
        {
            const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
            if (n != -1 && dir == *last_dir) // Already tried this direction?
                continue;

            const float avail_w = (dir == ImGuiDir_Left ? r_avoid.Min.x : r_outer.Max.x) - (dir == ImGuiDir_Right ? r_avoid.Max.x : r_outer.Min.x);
            const float avail_h = (dir == ImGuiDir_Up ? r_avoid.Min.y : r_outer.Max.y) - (dir == ImGuiDir_Down ? r_avoid.Max.y : r_outer.Min.y);

            // If there not enough room on one axis, there's no point in positioning on a side on this axis (e.g. when not enough width, use a top/bottom position to maximize available width)
            if (avail_w < size.x && (dir == ImGuiDir_Left || dir == ImGuiDir_Right))
                continue;
            if (avail_h < size.y && (dir == ImGuiDir_Up || dir == ImGuiDir_Down))
                continue;

            ImVec2 pos;
            pos.x = (dir == ImGuiDir_Left) ? r_avoid.Min.x - size.x : (dir == ImGuiDir_Right) ? r_avoid.Max.x : base_pos_clamped.x;
            pos.y = (dir == ImGuiDir_Up) ? r_avoid.Min.y - size.y : (dir == ImGuiDir_Down) ? r_avoid.Max.y : base_pos_clamped.y;

            // Clamp top-left corner of popup
            pos.x = ImMax(pos.x, r_outer.Min.x);
            pos.y = ImMax(pos.y, r_outer.Min.y);

            *last_dir = dir;
            return pos;
        }
    }

    // Fallback when not enough room:
    *last_dir = ImGuiDir_None;

    // For tooltip we prefer avoiding the cursor at all cost even if it means that part of the tooltip won't be visible.
    if (policy == ImGuiPopupPositionPolicy_Tooltip)
        return ref_pos + ImVec2(2, 2);

    // Otherwise try to keep within display
    ImVec2 pos = ref_pos;
    pos.x = ImMax(ImMin(pos.x + size.x, r_outer.Max.x) - size.x, r_outer.Min.x);
    pos.y = ImMax(ImMin(pos.y + size.y, r_outer.Max.y) - size.y, r_outer.Min.y);
    return pos;
}